

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::ClearInputKeys(ImGuiIO *this)

{
  float *pfVar1;
  long lVar2;
  
  memset(this->KeysDown,0,0x285);
  lVar2 = 0xe00;
  do {
    *(undefined1 *)((long)this + lVar2 + -4) = 0;
    *(undefined8 *)((long)&this->ConfigFlags + lVar2) = 0xbf800000bf800000;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x3650);
  this->KeyMods = 0;
  this->KeyCtrl = false;
  this->KeyShift = false;
  this->KeyAlt = false;
  this->KeySuper = false;
  lVar2 = -0x14;
  do {
    pfVar1 = this->NavInputsDownDurationPrev + lVar2 + 0x14;
    pfVar1[0] = -1.0;
    pfVar1[1] = -1.0;
    pfVar1[2] = -1.0;
    pfVar1[3] = -1.0;
    pfVar1 = this->NavInputsDownDurationPrev + lVar2;
    pfVar1[0] = -1.0;
    pfVar1[1] = -1.0;
    pfVar1[2] = -1.0;
    pfVar1[3] = -1.0;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0);
  return;
}

Assistant:

void ImGuiIO::ClearInputKeys()
{
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    memset(KeysDown, 0, sizeof(KeysDown));
#endif
    for (int n = 0; n < IM_ARRAYSIZE(KeysData); n++)
    {
        KeysData[n].Down             = false;
        KeysData[n].DownDuration     = -1.0f;
        KeysData[n].DownDurationPrev = -1.0f;
    }
    KeyCtrl = KeyShift = KeyAlt = KeySuper = false;
    KeyMods = ImGuiKeyModFlags_None;
    for (int n = 0; n < IM_ARRAYSIZE(NavInputsDownDuration); n++)
        NavInputsDownDuration[n] = NavInputsDownDurationPrev[n] = -1.0f;
}